

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall adios2sys::CommandLineArguments::CommandLineArguments(CommandLineArguments *this)

{
  pointer pbVar1;
  CommandLineArgumentsInternal *in_RDI;
  
  std::__cxx11::string::string
            ((string *)
             &(in_RDI->Argv).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = (pointer)operator_new(0x98);
  CommandLineArgumentsInternal::CommandLineArgumentsInternal(in_RDI);
  (in_RDI->Argv).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar1;
  std::__cxx11::string::operator=
            ((string *)
             &(in_RDI->Argv).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,"");
  *(undefined4 *)&(in_RDI->Argv0).field_2 = 0x50;
  (in_RDI->Argv0).field_2._M_local_buf[4] = '\0';
  return;
}

Assistant:

CommandLineArguments::CommandLineArguments()
{
  this->Internals = new CommandLineArguments::Internal;
  this->Help = "";
  this->LineLength = 80;
  this->StoreUnusedArgumentsFlag = false;
}